

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::XMLPrinter(XMLPrinter *this,FILE *file,bool compact,int depth)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  (this->super_XMLVisitor)._vptr_XMLVisitor = (_func_int **)&PTR__XMLPrinter_002a6110;
  this->_elementJustOpened = false;
  (this->_stack)._mem = (this->_stack)._pool;
  (this->_stack)._allocated = 10;
  (this->_stack)._size = 0;
  this->_firstElement = true;
  this->_fp = file;
  this->_depth = depth;
  this->_textDepth = -1;
  this->_processEntities = true;
  this->_compactMode = compact;
  (this->_buffer)._mem = (this->_buffer)._pool;
  (this->_buffer)._allocated = 0x14;
  (this->_buffer)._size = 0;
  auVar3 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])this->_entityFlag = ZEXT1632(auVar3);
  *(undefined1 (*) [32])(this->_entityFlag + 0x20) = ZEXT1632(auVar3);
  *(undefined1 (*) [32])this->_restrictedEntityFlag = ZEXT1632(auVar3);
  *(undefined1 (*) [32])(this->_restrictedEntityFlag + 0x20) = ZEXT1632(auVar3);
  lVar2 = 0xc;
  do {
    this->_entityFlag[*(byte *)((long)&entities + lVar2)] = true;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x5c);
  this->_restrictedEntityFlag[0x26] = true;
  this->_restrictedEntityFlag[0x3c] = true;
  this->_restrictedEntityFlag[0x3e] = true;
  DynArray<char,_20>::EnsureCapacity(&this->_buffer,1);
  iVar1 = (this->_buffer)._size;
  (this->_buffer)._size = iVar1 + 1;
  (this->_buffer)._mem[iVar1] = '\0';
  return;
}

Assistant:

XMLPrinter::XMLPrinter( FILE* file, bool compact, int depth ) :
    _elementJustOpened( false ),
    _firstElement( true ),
    _fp( file ),
    _depth( depth ),
    _textDepth( -1 ),
    _processEntities( true ),
    _compactMode( compact )
{
    for( int i=0; i<ENTITY_RANGE; ++i ) {
        _entityFlag[i] = false;
        _restrictedEntityFlag[i] = false;
    }
    for( int i=0; i<NUM_ENTITIES; ++i ) {
        const char entityValue = entities[i].value;
        TIXMLASSERT( 0 <= entityValue && entityValue < ENTITY_RANGE );
        _entityFlag[ (unsigned char)entityValue ] = true;
    }
    _restrictedEntityFlag[(unsigned char)'&'] = true;
    _restrictedEntityFlag[(unsigned char)'<'] = true;
    _restrictedEntityFlag[(unsigned char)'>'] = true;	// not required, but consistency is nice
    _buffer.Push( 0 );
}